

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O2

int Abc_ExorcismMain(Vec_Wec_t *vEsop,int nIns,int nOuts,char *pFileNameOut,int Quality,
                    int Verbosity)

{
  int iVar1;
  
  g_CoverInfo.TimeRead = 0;
  g_CoverInfo.nLiteralsBefore = 0;
  g_CoverInfo.nLiteralsAfter = 0;
  g_CoverInfo.TimeStart = 0;
  g_CoverInfo.TimeMin = 0;
  g_CoverInfo.nCubesAlloc = 0;
  g_CoverInfo.nCubesBefore = 0;
  g_CoverInfo.nCubesInUse = 0;
  g_CoverInfo.nCubesFree = 0;
  g_CoverInfo.nVarsIn = 0;
  g_CoverInfo.nVarsOut = 0;
  g_CoverInfo.nWordsIn = 0;
  g_CoverInfo.nWordsOut = 0;
  g_CoverInfo._52_4_ = 0;
  g_CoverInfo.Quality = Quality;
  g_CoverInfo._40_8_ = (ulong)(uint)Verbosity << 0x20;
  if (Verbosity != 0) {
    puts("\nEXORCISM, Ver.4.7: Exclusive Sum-of-Product Minimizer");
    puts("by Alan Mishchenko, Portland State University, July-September 2000\n");
    printf("Incoming ESOP has %d inputs, %d outputs, and %d cubes.\n",(ulong)(uint)nIns,
           (ulong)(uint)nOuts,(ulong)(uint)vEsop->nSize);
  }
  PrepareBitSetModule();
  iVar1 = Exorcism(vEsop,nIns,nOuts,pFileNameOut);
  if (iVar1 == 0) {
    puts("Something went wrong when minimizing the cover");
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int Abc_ExorcismMain( Vec_Wec_t * vEsop, int nIns, int nOuts, char * pFileNameOut, int Quality, int Verbosity )
{
    memset( &g_CoverInfo, 0, sizeof(cinfo) );
    g_CoverInfo.Quality = Quality;
    g_CoverInfo.Verbosity = Verbosity;
    if ( g_CoverInfo.Verbosity )
    {
        printf( "\nEXORCISM, Ver.4.7: Exclusive Sum-of-Product Minimizer\n" );
        printf( "by Alan Mishchenko, Portland State University, July-September 2000\n\n" );
        printf( "Incoming ESOP has %d inputs, %d outputs, and %d cubes.\n", nIns, nOuts, Vec_WecSize(vEsop) );
    }
    PrepareBitSetModule();
    if ( Exorcism( vEsop, nIns, nOuts, pFileNameOut ) == 0 )
    {
        printf( "Something went wrong when minimizing the cover\n" );
        return 0;
    }
    return 1;
}